

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O3

int zp2(DdManager *zdd,DdNode *f,st__table *t)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  int iVar3;
  int iVar4;
  
  if (f == (DdNode *)0x0) {
LAB_007b0f1d:
    iVar3 = 0;
  }
  else {
    pDVar1 = zdd->one;
    if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
      fprintf((FILE *)zdd->out,"ID = %d\n",(ulong)(pDVar1 == f));
    }
    else {
      iVar3 = st__lookup(t,(char *)f,(char **)0x0);
      if (iVar3 != 1) {
        iVar3 = st__insert(t,(char *)f,(char *)0x0);
        if (iVar3 == -10000) {
          return 0;
        }
        fprintf((FILE *)zdd->out,"ID = 0x%lx\tindex = %u\tr = %u\t",(ulong)f / 0x28,(ulong)f->index,
                (ulong)f->ref);
        pDVar2 = (f->type).kids.T;
        iVar3 = *(int *)((ulong)pDVar2 & 0xfffffffffffffffe);
        if (iVar3 == 0x7fffffff) {
          fprintf((FILE *)zdd->out,"T = %d\t\t",(ulong)(pDVar2 == pDVar1));
        }
        else {
          fprintf((FILE *)zdd->out,"T = 0x%lx\t",(ulong)pDVar2 / 0x28);
        }
        pDVar2 = (f->type).kids.E;
        if (*(int *)((ulong)pDVar2 & 0xfffffffffffffffe) == 0x7fffffff) {
          fprintf((FILE *)zdd->out,"E = %d\n",(ulong)(pDVar2 == pDVar1));
        }
        else {
          fprintf((FILE *)zdd->out,"E = 0x%lx\n",(ulong)pDVar2 / 0x28);
          iVar4 = zp2(zdd,(f->type).kids.E,t);
          if (iVar4 == 0) {
            return 0;
          }
        }
        if ((iVar3 != 0x7fffffff) && (iVar3 = zp2(zdd,(f->type).kids.T,t), iVar3 == 0))
        goto LAB_007b0f1d;
      }
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
zp2(
  DdManager * zdd,
  DdNode * f,
  st__table * t)
{
    DdNode      *n;
    int         T, E;
    DdNode      *base = DD_ONE(zdd);

    if (f == NULL)
        return(0);

    if (Cudd_IsConstant(f)) {
        (void)fprintf(zdd->out, "ID = %d\n", (f == base));
        return(1);
    }
    if ( st__is_member(t, (char *)f) == 1)
        return(1);

    if ( st__insert(t, (char *) f, NULL) == st__OUT_OF_MEM)
        return(0);

#if SIZEOF_VOID_P == 8
    (void) fprintf(zdd->out, "ID = 0x%lx\tindex = %u\tr = %u\t",
        (ptruint)f / (ptruint) sizeof(DdNode), f->index, f->ref);
#else
    (void) fprintf(zdd->out, "ID = 0x%x\tindex = %hu\tr = %hu\t",
        (ptruint)f / (ptruint) sizeof(DdNode), f->index, f->ref);
#endif

    n = cuddT(f);
    if (Cudd_IsConstant(n)) {
        (void) fprintf(zdd->out, "T = %d\t\t", (n == base));
        T = 1;
    } else {
#if SIZEOF_VOID_P == 8
        (void) fprintf(zdd->out, "T = 0x%lx\t", (ptruint) n /
                       (ptruint) sizeof(DdNode));
#else
        (void) fprintf(zdd->out, "T = 0x%x\t", (ptruint) n /
                       (ptruint) sizeof(DdNode));
#endif
        T = 0;
    }

    n = cuddE(f);
    if (Cudd_IsConstant(n)) {
        (void) fprintf(zdd->out, "E = %d\n", (n == base));
        E = 1;
    } else {
#if SIZEOF_VOID_P == 8
        (void) fprintf(zdd->out, "E = 0x%lx\n", (ptruint) n /
                      (ptruint) sizeof(DdNode));
#else
        (void) fprintf(zdd->out, "E = 0x%x\n", (ptruint) n /
                       (ptruint) sizeof(DdNode));
#endif
        E = 0;
    }

    if (E == 0)
        if (zp2(zdd, cuddE(f), t) == 0) return(0);
    if (T == 0)
        if (zp2(zdd, cuddT(f), t) == 0) return(0);
    return(1);

}